

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_thread_pool.h
# Opt level: O0

void __thiscall simple_thread_pool::EventAwaiter::wait_us(EventAwaiter *this,size_t time_us)

{
  bool bVar1;
  unsigned_long in_RSI;
  atomic<simple_thread_pool::EventAwaiter::AS> *in_RDI;
  unique_lock<std::mutex> l;
  AS expected;
  mutex_type *in_stack_ffffffffffffffa8;
  unique_lock<std::mutex> *in_stack_ffffffffffffffb0;
  memory_order in_stack_ffffffffffffffc0;
  AS in_stack_ffffffffffffffc4;
  AS *in_stack_ffffffffffffffc8;
  duration<long,_std::ratio<1L,_1000000L>_> *in_stack_ffffffffffffffd0;
  unique_lock<std::mutex> *in_stack_ffffffffffffffd8;
  condition_variable *in_stack_ffffffffffffffe0;
  unsigned_long local_10 [2];
  
  local_10[0] = in_RSI;
  bVar1 = std::atomic<simple_thread_pool::EventAwaiter::AS>::compare_exchange_strong
                    ((atomic<simple_thread_pool::EventAwaiter::AS> *)in_stack_ffffffffffffffd0,
                     in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
  if (bVar1) {
    std::unique_lock<std::mutex>::unique_lock(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    bVar1 = std::atomic<simple_thread_pool::EventAwaiter::AS>::compare_exchange_strong
                      ((atomic<simple_thread_pool::EventAwaiter::AS> *)in_stack_ffffffffffffffd0,
                       in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0
                      );
    if (bVar1) {
      if (local_10[0] == 0) {
        std::condition_variable::wait((unique_lock *)(in_RDI + 0xc));
      }
      else {
        in_stack_ffffffffffffffb0 = (unique_lock<std::mutex> *)(in_RDI + 0xc);
        std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<unsigned_long,void>
                  ((duration<long,std::ratio<1l,1000000l>> *)&stack0xffffffffffffffd0,local_10);
        std::condition_variable::wait_for<long,std::ratio<1l,1000000l>>
                  (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      }
      std::atomic<simple_thread_pool::EventAwaiter::AS>::store(in_RDI,done,memory_order_seq_cst);
    }
    std::unique_lock<std::mutex>::~unique_lock(in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

void wait_us(size_t time_us) {
        AS expected = AS::idle;
        if (status.compare_exchange_strong(expected, AS::ready)) {
            // invoke() has not been invoked yet, wait for it.
            std::unique_lock<std::mutex> l(cvLock);
            expected = AS::ready;
            if (status.compare_exchange_strong(expected, AS::waiting)) {
                if (time_us) {
                    cv.wait_for(l, std::chrono::microseconds(time_us));
                } else {
                    cv.wait(l);
                }
                status.store(AS::done);
            } else {
                // invoke() has grabbed `cvLock` earlier than this.
            }
        } else {
            // invoke() already has been called earlier than this.
        }
    }